

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O3

bool deqp::gls::isEdgeTriplet(RGBA *c1,RGBA *c2,RGBA *c3,IVec3 *renderTargetThreshold)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  uVar2 = (uint)c3;
  uVar3 = (uint)c2;
  if (((ulong)c1 & 0xffffff) != 0) {
    bVar1 = true;
    if (((ulong)c2 & 0xffffff) != 0 && ((ulong)c3 & 0xffffff) != 0) {
      iVar4 = (uVar2 & 0xff) + ((uint)c1 & 0xff) + (uVar3 & 0xff) * -2;
      iVar5 = -iVar4;
      if (0 < iVar4) {
        iVar5 = iVar4;
      }
      if (iVar5 <= renderTargetThreshold->m_data[0] * 2) {
        iVar4 = (((uint)((ulong)c1 >> 8) & 0xff) - ((uint)((ulong)c2 >> 7) & 0x1fe)) +
                ((uint)((ulong)c3 >> 8) & 0xff);
        iVar5 = -iVar4;
        if (0 < iVar4) {
          iVar5 = iVar4;
        }
        if (iVar5 <= renderTargetThreshold->m_data[1] * 2) {
          iVar4 = (((uint)c1 >> 0x10 & 0xff) - (uVar3 >> 0xf & 0x1fe)) + (uVar2 >> 0x10 & 0xff);
          iVar5 = -iVar4;
          if (0 < iVar4) {
            iVar5 = iVar4;
          }
          bVar1 = renderTargetThreshold->m_data[2] * 2 < iVar5;
        }
      }
    }
    return bVar1;
  }
  return ((uVar3 | uVar2) & 0xffffff) != 0;
}

Assistant:

static bool isBlack (const tcu::RGBA& c)
{
	// ignore alpha channel
	return c.getRed() == 0 && c.getGreen() == 0 && c.getBlue() == 0;
}